

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

Error * ot::commissioner::CommissionerImpl::DecodePendingOperationalDataset
                  (Error *__return_storage_ptr__,PendingOperationalDataset *aDataset,
                  Response *aResponse)

{
  bool bVar1;
  ByteArray *pBVar2;
  Error *pEVar3;
  mapped_type *pmVar4;
  element_type *peVar5;
  unsigned_long aValue;
  uint64_t value;
  undefined1 local_1d0 [8];
  mapped_type pendingTimestamp;
  undefined1 local_1b8 [8];
  mapped_type delayTimer;
  Error local_1a0;
  ErrorCode local_174;
  Error local_170;
  undefined1 local_138 [8];
  PendingOperationalDataset dataset;
  TlvSet tlvSet;
  Response *aResponse_local;
  PendingOperationalDataset *aDataset_local;
  Error *error;
  
  Error::Error(__return_storage_ptr__);
  std::
  map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::map((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
         *)&dataset.mPendingTimestamp);
  PendingOperationalDataset::PendingOperationalDataset((PendingOperationalDataset *)local_138);
  dataset.super_ActiveOperationalDataset.mSecurityPolicy.mFlags.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_2_ = 0;
  pBVar2 = coap::Message::GetPayload(aResponse);
  DecodeActiveOperationalDataset(&local_170,(ActiveOperationalDataset *)local_138,pBVar2);
  pEVar3 = Error::operator=(__return_storage_ptr__,&local_170);
  local_174 = kNone;
  bVar1 = commissioner::operator!=(pEVar3,&local_174);
  Error::~Error(&local_170);
  if (!bVar1) {
    GetTlvSet(&local_1a0,(TlvSet *)&dataset.mPendingTimestamp,aResponse,kMeshCoP);
    pEVar3 = Error::operator=(__return_storage_ptr__,&local_1a0);
    delayTimer.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ = 0;
    bVar1 = commissioner::operator!=
                      (pEVar3,(ErrorCode *)
                              ((long)&delayTimer.
                                      super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi + 4));
    Error::~Error(&local_1a0);
    if (!bVar1) {
      pendingTimestamp.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._7_1_ = 0x34;
      pmVar4 = std::
               map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
               ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                             *)&dataset.mPendingTimestamp,
                            (key_type *)
                            ((long)&pendingTimestamp.
                                    super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi + 7));
      std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
                ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_1b8,pmVar4);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1b8);
      if (bVar1) {
        peVar5 = std::
                 __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_1b8);
        pBVar2 = tlv::Tlv::GetValue(peVar5);
        dataset.super_ActiveOperationalDataset.mSecurityPolicy.mFlags.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = utils::Decode<unsigned_int>(pBVar2);
        dataset.super_ActiveOperationalDataset.mSecurityPolicy.mFlags.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_2_ =
             (ushort)dataset.super_ActiveOperationalDataset.mSecurityPolicy.mFlags.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage | 0x20;
      }
      std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
                ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_1b8);
      value._7_1_ = 0x33;
      pmVar4 = std::
               map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
               ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                             *)&dataset.mPendingTimestamp,(key_type *)((long)&value + 7));
      std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
                ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_1d0,pmVar4);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1d0);
      if (bVar1) {
        peVar5 = std::
                 __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_1d0);
        pBVar2 = tlv::Tlv::GetValue(peVar5);
        aValue = utils::Decode<unsigned_long>(pBVar2);
        dataset.super_ActiveOperationalDataset._208_8_ = Timestamp::Decode(aValue);
        dataset.super_ActiveOperationalDataset.mSecurityPolicy.mFlags.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_2_ =
             (ushort)dataset.super_ActiveOperationalDataset.mSecurityPolicy.mFlags.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage | 0x10;
      }
      std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
                ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_1d0);
      PendingOperationalDataset::operator=(aDataset,(PendingOperationalDataset *)local_138);
    }
  }
  PendingOperationalDataset::~PendingOperationalDataset((PendingOperationalDataset *)local_138);
  std::
  map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::~map((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
          *)&dataset.mPendingTimestamp);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::DecodePendingOperationalDataset(PendingOperationalDataset &aDataset,
                                                        const coap::Response      &aResponse)
{
    Error                     error;
    tlv::TlvSet               tlvSet;
    PendingOperationalDataset dataset;

    // Clear all data fields
    dataset.mPresentFlags = 0;

    SuccessOrExit(error = DecodeActiveOperationalDataset(dataset, aResponse.GetPayload()));
    SuccessOrExit(error = GetTlvSet(tlvSet, aResponse));

    if (auto delayTimer = tlvSet[tlv::Type::kDelayTimer])
    {
        dataset.mDelayTimer = utils::Decode<uint32_t>(delayTimer->GetValue());
        dataset.mPresentFlags |= PendingOperationalDataset::kDelayTimerBit;
    }

    if (auto pendingTimestamp = tlvSet[tlv::Type::kPendingTimestamp])
    {
        uint64_t value;
        value                     = utils::Decode<uint64_t>(pendingTimestamp->GetValue());
        dataset.mPendingTimestamp = Timestamp::Decode(value);
        dataset.mPresentFlags |= PendingOperationalDataset::kPendingTimestampBit;
    }

    aDataset = dataset;

exit:
    return error;
}